

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O2

size_t __thiscall
RVO::RVOSimulator::addAgent
          (RVOSimulator *this,Vector2 *position,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  Agent *this_00;
  Agent *agent;
  Agent *local_30;
  
  this_00 = (Agent *)operator_new(0x90);
  Agent::Agent(this_00);
  this_00->position_ = *position;
  this_00->velocity_ = *velocity;
  this_00->id_ = (long)(this->agents_).
                       super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->agents_).
                       super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
  this_00->maxNeighbors_ = maxNeighbors;
  this_00->maxSpeed_ = maxSpeed;
  this_00->neighborDist_ = neighborDist;
  this_00->radius_ = radius;
  this_00->timeHorizon_ = timeHorizon;
  this_00->timeHorizonObst_ = timeHorizonObst;
  local_30 = this_00;
  std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(&this->agents_,&local_30);
  return ((long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
}

Assistant:

std::size_t RVOSimulator::addAgent(const Vector2 &position, float neighborDist,
                                   std::size_t maxNeighbors, float timeHorizon,
                                   float timeHorizonObst, float radius,
                                   float maxSpeed, const Vector2 &velocity) {
  Agent *const agent = new Agent();
  agent->position_ = position;
  agent->velocity_ = velocity;
  agent->id_ = agents_.size();
  agent->maxNeighbors_ = maxNeighbors;
  agent->maxSpeed_ = maxSpeed;
  agent->neighborDist_ = neighborDist;
  agent->radius_ = radius;
  agent->timeHorizon_ = timeHorizon;
  agent->timeHorizonObst_ = timeHorizonObst;
  agents_.push_back(agent);

  return agents_.size() - 1U;
}